

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaParams.cpp
# Opt level: O2

void __thiscall
NaParams::NaParams(NaParams *this,char *szFileName,int argc,char **argv,char *szSpecChar)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  item_t *piVar8;
  char **ppcVar9;
  size_t sVar10;
  char **ppcVar11;
  undefined4 *puVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  char *value;
  char *name;
  ulong local_50;
  FILE *local_48;
  char **local_40;
  char szAbsent [8];
  
  this->_vptr_NaParams = (_func_int **)&PTR__NaParams_00177c48;
  if (szSpecChar == (char *)0x0) {
    puVar12 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar12 = 0;
LAB_00154685:
    __cxa_throw(puVar12,&NaException::typeinfo,0);
  }
  local_50 = (ulong)(uint)argc;
  this->spec[0] = *szSpecChar;
  this->spec[1] = szSpecChar[1];
  this->stored_n = 0;
  local_40 = argv;
  if (szFileName != (char *)0x0) {
    pcVar5 = strdup(szFileName);
    pcVar6 = strstr(pcVar5,".par");
    if ((pcVar6 != (char *)0x0) && (pcVar6[4] == '\0')) {
      NaCloseLogFile();
      builtin_strncpy(pcVar6,".log",5);
      pcVar7 = strrchr(pcVar5,0x2f);
      pcVar6 = pcVar5 + -1;
      if (pcVar7 != (char *)0x0) {
        pcVar6 = pcVar7;
      }
      NaOpenLogFile(pcVar6 + 1);
    }
    free(pcVar5);
    local_48 = fopen(szFileName,"rb");
    if (local_48 == (FILE *)0x0) {
      puVar12 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar12 = 5;
      goto LAB_00154685;
    }
    pcVar5 = this->buf;
    while (pcVar6 = fgets(pcVar5,0x3ff,local_48), pcVar6 != (char *)0x0) {
      iVar4 = this->stored_n;
      pcVar6 = pcVar5;
      if ((iVar4 == 0) && (iVar3 = bcmp(pcVar5,anon_var_dwarf_3943,3), iVar3 == 0)) {
        pcVar6 = this->buf + 3;
      }
      do {
        cVar1 = *pcVar6;
        iVar3 = isspace((int)cVar1);
        if (cVar1 == '\0') break;
        pcVar6 = pcVar6 + 1;
      } while (iVar3 != 0);
      if ((cVar1 != '\0') && (cVar1 != this->spec[0])) {
        this->stored_n = iVar4 + 1;
      }
    }
    rewind(local_48);
    argc = (int)local_50;
  }
  iVar4 = this->stored_n;
  if (local_40 != (char **)0x0 && 0 < argc) {
    iVar4 = iVar4 + argc;
    this->stored_n = iVar4;
  }
  if (iVar4 == 0) {
    NaPrintLog("File \'%s\' does not contain parameters.\n",szFileName);
    this->storage = (item_t *)0x0;
  }
  else {
    builtin_strncpy(szAbsent,"?absent",8);
    uVar14 = 0xffffffffffffffff;
    if (-1 < iVar4) {
      uVar14 = (long)iVar4 << 4;
    }
    piVar8 = (item_t *)operator_new__(uVar14);
    this->storage = piVar8;
    this->stored_n = 0;
LAB_00154360:
    pcVar5 = fgets(this->buf,0x3ff,local_48);
    if (pcVar5 != (char *)0x0) {
      bVar2 = parse_line(this,this->buf,&name,&value);
      pcVar5 = name;
      if (!bVar2) goto LAB_0015439e;
      goto LAB_001543ad;
    }
    uVar14 = local_50 & 0xffffffff;
    if ((int)local_50 < 1) {
      uVar14 = 0;
    }
    ppcVar9 = local_40;
    local_50 = uVar14;
    for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
      bVar2 = parse_line(this,ppcVar9[uVar15],&name,&value);
      pcVar5 = name;
      if (bVar2) {
LAB_0015450f:
        pcVar6 = value;
        NaPrintLog("cmd.line: name=\'%s\' value=\'%s\' ",name,value);
        bVar2 = CheckParam(this,pcVar5);
        if (bVar2) {
          ppcVar11 = FetchParam(this,pcVar5);
          if (*ppcVar11 != (char *)0x0) {
            operator_delete__(*ppcVar11);
          }
          sVar10 = strlen(pcVar6);
          pcVar5 = (char *)operator_new__(sVar10 + 1);
          *ppcVar11 = pcVar5;
          strcpy(pcVar5,pcVar6);
          pcVar5 = "REPLACE\n";
        }
        else {
          sVar10 = strlen(pcVar5);
          pcVar7 = (char *)operator_new__(sVar10 + 1);
          piVar8 = this->storage;
          lVar13 = (long)this->stored_n;
          piVar8[lVar13].name = pcVar7;
          strcpy(pcVar7,pcVar5);
          sVar10 = strlen(pcVar6);
          pcVar5 = (char *)operator_new__(sVar10 + 1);
          piVar8[lVar13].value = pcVar5;
          strcpy(pcVar5,pcVar6);
          ppcVar9 = local_40;
          uVar14 = local_50;
          this->stored_n = (int)(lVar13 + 1U);
          qsort(piVar8,lVar13 + 1U,0x10,stored_cmp);
          pcVar5 = "APPEND\n";
        }
        NaPrintLog(pcVar5);
      }
      else if (name != (char *)0x0) {
        value = szAbsent;
        goto LAB_0015450f;
      }
    }
  }
  fclose(local_48);
  qsort(this->storage,(long)this->stored_n,0x10,stored_cmp);
  return;
LAB_0015439e:
  if (name != (char *)0x0) {
    value = szAbsent;
LAB_001543ad:
    pcVar6 = value;
    NaPrintLog("name=\'%s\' value=\'%s\' ",name,value);
    bVar2 = CheckParam(this,pcVar5);
    if (bVar2) {
      ppcVar9 = FetchParam(this,pcVar5);
      if (*ppcVar9 != (char *)0x0) {
        operator_delete__(*ppcVar9);
      }
      sVar10 = strlen(pcVar6);
      pcVar5 = (char *)operator_new__(sVar10 + 1);
      *ppcVar9 = pcVar5;
      strcpy(pcVar5,pcVar6);
      pcVar5 = "REPLACE\n";
    }
    else {
      sVar10 = strlen(pcVar5);
      pcVar7 = (char *)operator_new__(sVar10 + 1);
      piVar8 = this->storage;
      lVar13 = (long)this->stored_n;
      piVar8[lVar13].name = pcVar7;
      strcpy(pcVar7,pcVar5);
      sVar10 = strlen(pcVar6);
      pcVar5 = (char *)operator_new__(sVar10 + 1);
      piVar8[lVar13].value = pcVar5;
      strcpy(pcVar5,pcVar6);
      this->stored_n = (int)(lVar13 + 1U);
      qsort(piVar8,lVar13 + 1U,0x10,stored_cmp);
      pcVar5 = "APPEND\n";
    }
    NaPrintLog(pcVar5);
  }
  goto LAB_00154360;
}

Assistant:

NaParams::NaParams (const char* szFileName,
		    /* Extra values in format argv[i]=" name = value " */
		    int argc, char** argv,
		    const char szSpecChar[2])
{
  if(NULL == szSpecChar)
    throw(na_null_pointer);

  spec[COMMENT] = szSpecChar[COMMENT];
  spec[ASSIGN] = szSpecChar[ASSIGN];

  FILE	*fp;
  stored_n = 0;

  if(NULL != szFileName)
    {
      // open special logfile derived from name of parameter
      char	*szPath = strdup(szFileName);
      char	*szExt = strstr(szPath, ".par");
      if(NULL != szExt && szExt[4] == '\0')
	{
	  // let's replace log file with new one but in current directory
	  NaCloseLogFile();
	  strcpy(szExt, ".log");
	  char	*szFile = strrchr(szPath, '/');
	  if(NULL == szFile)
	    /* local already */
	    szFile = szPath - 1;
	  NaOpenLogFile(szFile + 1);
	}
      free(szPath);

      // open file
      fp = fopen(szFileName, "rb"); // rt
      if(NULL == fp)
	throw(na_cant_open_file);

      // read file to get high estimation for number of lines in it
      while(NULL != fgets(buf, NaPARAM_LINE_MAX_LEN, fp))
	{
	  // skip leading spaces
	  char	*p;

	  p = buf;

	  if(0 == stored_n &&
	     !strncmp(p, NaBOM_utf8, strlen(NaBOM_utf8))){
	      // BOM is found -> it's OK
	      p += strlen(NaBOM_utf8);
	  }

	  // skip leading spaces before name
	  while(isspace(*p) && *p != '\0')
	    ++p;
	  if(*p != '\0' && *p != spec[COMMENT])
	    // non-empty line
	    ++stored_n;
	  // else
	  //   no name in this line due to empty line
	}

      // rewind file
      rewind(fp);
    }

  if(argc > 0 && argv != NULL)
    {
      // add lines for additional arguments in command line
      stored_n += argc;
    }

  // allocate storage
  if(0 == stored_n)
    {
      NaPrintLog("File '%s' does not contain parameters.\n",
		 szFileName);
      storage = NULL;
    }
  else
    {
      char	*name, *value;
      char	szAbsent[] = "?absent";
      storage = new item_t[stored_n];

      //int	item_i = 0;
      stored_n = 0;

      // read file to the storage
      while(NULL != fgets(buf, NaPARAM_LINE_MAX_LEN, fp))
	{
	  // parse line of text
	  if(!parse_line(buf, name, value))
	    {
	      if(NULL == name)
		// comment line
		continue;
	      // empty value
	      value = szAbsent;
	    }

	  NaPrintLog("name='%s' value='%s' ", name, value);

	  if(CheckParam(name))
	    {
	      // already exist -> replace value
	      char*&	value_ref = FetchParam(name);
	      delete[] value_ref;

	      value_ref = new char[strlen(value) + 1];
	      strcpy(value_ref, value);

	      NaPrintLog("REPLACE\n");
	    }
	  else
	    {
	      // not exist
	      storage[stored_n].name = new char[strlen(name) + 1];
	      strcpy(storage[stored_n].name, name);

	      storage[stored_n].value = new char[strlen(value) + 1];
	      strcpy(storage[stored_n].value, value);

	      // go to next command line argument and next item
	      ++stored_n;

	      // quick sort the storage to have proper order
	      qsort(storage, stored_n, sizeof(item_t), stored_cmp);

	      NaPrintLog("APPEND\n");
	    }
	}

      // parse additional arguments from command line
      int	i;
      for(i = 0; i < argc; ++i)
	{
	  // parse command line argument
	  if(!parse_line(argv[i], name, value))
	    {
	      if(NULL == name)
		// comment line
		continue;
	      // empty value
	      value = szAbsent;
	    }

	  NaPrintLog("cmd.line: name='%s' value='%s' ", name, value);

	  if(CheckParam(name))
	    {
	      // already exist -> replace value
	      char*&	value_ref = FetchParam(name);
	      delete[] value_ref;

	      value_ref = new char[strlen(value) + 1];
	      strcpy(value_ref, value);

	      NaPrintLog("REPLACE\n");
	    }
	  else
	    {
	      // not exist
	      storage[stored_n].name = new char[strlen(name) + 1];
	      strcpy(storage[stored_n].name, name);

	      storage[stored_n].value = new char[strlen(value) + 1];
	      strcpy(storage[stored_n].value, value);

	      // go to next command line argument and next item
	      ++stored_n;

	      // quick sort the storage to have proper order
	      qsort(storage, stored_n, sizeof(item_t), stored_cmp);

	      NaPrintLog("APPEND\n");
	    }
	}

      //stored_n = item_i;
    }

  fclose(fp);

  // quick sort the storage
  qsort(storage, stored_n, sizeof(item_t), stored_cmp);
}